

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O3

void on_client_timeout(uv_timer_t *handle)

{
  int iVar1;
  long *plVar2;
  int64_t eval_b;
  int64_t eval_a;
  long local_18;
  
  if (handle == &timer) {
    local_18 = (long)read_cb_called;
    if (local_18 == 0) {
      uv_read_stop(&client);
      uv_close(&client,on_close);
      uv_close(&timer,on_close);
      return;
    }
  }
  else {
    on_client_timeout_cold_1();
  }
  plVar2 = &local_18;
  on_client_timeout_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(plVar2,0);
  return;
}

Assistant:

static void on_client_timeout(uv_timer_t* handle) {
  ASSERT_PTR_EQ(handle, &timer);
  ASSERT_OK(read_cb_called);
  uv_read_stop((uv_stream_t*) &client);
  uv_close((uv_handle_t*) &client, on_close);
  uv_close((uv_handle_t*) &timer, on_close);
}